

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

int __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::GetMaxHeight
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this)

{
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return (this->max_height_).super___atomic_base<int>._M_i;
}

Assistant:

inline int GetMaxHeight() const {
    return max_height_.load(std::memory_order_relaxed);
  }